

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O0

void belt32BlockEncr(octet *block,u32 *key,u32 *round)

{
  uint uVar1;
  uint *in_RDX;
  u32 *in_RSI;
  u32 *in_RDI;
  u32 *t;
  void *in_stack_ffffffffffffffd8;
  
  u32From(in_RDI,in_stack_ffffffffffffffd8,0x1558b1);
  beltBlockEncr3(in_RDI + 2,in_RDI + 3,in_RDI + 4,in_RDI + 5,in_RSI);
  uVar1 = *in_RDX;
  *in_RDX = uVar1 + 1;
  in_RDI[2] = uVar1 ^ in_RDI[2];
  *in_RDI = in_RDI[2] ^ *in_RDI;
  in_RDI[1] = in_RDI[3] ^ in_RDI[1];
  beltBlockEncr3(in_RDI + 4,in_RDI + 5,in_RDI,in_RDI + 1,in_RSI);
  uVar1 = *in_RDX;
  *in_RDX = uVar1 + 1;
  in_RDI[4] = uVar1 ^ in_RDI[4];
  in_RDI[2] = in_RDI[4] ^ in_RDI[2];
  in_RDI[3] = in_RDI[5] ^ in_RDI[3];
  beltBlockEncr3(in_RDI,in_RDI + 1,in_RDI + 2,in_RDI + 3,in_RSI);
  uVar1 = *in_RDX;
  *in_RDX = uVar1 + 1;
  *in_RDI = uVar1 ^ *in_RDI;
  in_RDI[4] = *in_RDI ^ in_RDI[4];
  in_RDI[5] = in_RDI[1] ^ in_RDI[5];
  u32To(in_RDI,(size_t)in_stack_ffffffffffffffd8,(u32 *)0x1559ff);
  return;
}

Assistant:

static void belt32BlockEncr(octet block[24], const u32 key[8])
{
	u32* t = (u32*)block;
	u32From(t, block, 24);
	// round #1
	beltBlockEncr3(t + 2, t + 3, t + 4, t + 5, key);
	t[2] ^= 1, t[0] ^= t[2], t[1] ^= t[3];
	// round #2
	beltBlockEncr3(t + 4, t + 5, t + 0, t + 1, key);
	t[4] ^= 2, t[2] ^= t[4], t[3] ^= t[5];
	// round #3
	beltBlockEncr3(t + 0, t + 1, t + 2, t + 3, key);
	t[0] ^= 3, t[4] ^= t[0], t[5] ^= t[1];
	// возврат
	u32To(block, 24, t);
}